

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_copy.c
# Opt level: O0

void crypto_sign_ed25519_ref10_fe_copy(int32_t *h,int32_t *f)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t f9;
  int32_t f8;
  int32_t f7;
  int32_t f6;
  int32_t f5;
  int32_t f4;
  int32_t f3;
  int32_t f2;
  int32_t f1;
  int32_t f0;
  int32_t *f_local;
  int32_t *h_local;
  
  iVar1 = f[1];
  iVar2 = f[2];
  iVar3 = f[3];
  iVar4 = f[4];
  iVar5 = f[5];
  iVar6 = f[6];
  iVar7 = f[7];
  iVar8 = f[8];
  iVar9 = f[9];
  *h = *f;
  h[1] = iVar1;
  h[2] = iVar2;
  h[3] = iVar3;
  h[4] = iVar4;
  h[5] = iVar5;
  h[6] = iVar6;
  h[7] = iVar7;
  h[8] = iVar8;
  h[9] = iVar9;
  return;
}

Assistant:

void fe_copy(fe h,const fe f)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  h[0] = f0;
  h[1] = f1;
  h[2] = f2;
  h[3] = f3;
  h[4] = f4;
  h[5] = f5;
  h[6] = f6;
  h[7] = f7;
  h[8] = f8;
  h[9] = f9;
}